

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

void __thiscall Expr::ForceIDEval(Expr *this,Output *out_cc,Env *env)

{
  bool bVar1;
  CaseExprList *pCVar2;
  ExprList *pEVar3;
  int i;
  pointer ppCVar4;
  long lVar5;
  pointer ppEVar6;
  
  do {
    switch(this->expr_type_) {
    case EXPR_ID:
      bVar1 = Env::Evaluated(env,this->id_);
      if (!bVar1) {
        Env::Evaluate(env,out_cc,this->id_);
        return;
      }
    case EXPR_NUM:
    case EXPR_SIZEOF:
    case EXPR_OFFSETOF:
      return;
    case EXPR_MEMBER:
      this = this->operand_[0];
      break;
    case EXPR_CALLARGS:
      pEVar3 = this->args_;
      if (pEVar3 == (ExprList *)0x0) {
        return;
      }
      for (ppEVar6 = (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppEVar6 !=
          (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppEVar6 = ppEVar6 + 1) {
        ForceIDEval(*ppEVar6,out_cc,env);
        pEVar3 = this->args_;
      }
      return;
    default:
      if (this->expr_type_ == EXPR_CASE) {
        ForceIDEval(this->operand_[0],out_cc,env);
        pCVar2 = this->cases_;
        if (pCVar2 == (CaseExprList *)0x0) {
          return;
        }
        for (ppCVar4 = (pCVar2->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl
                       .super__Vector_impl_data._M_start;
            ppCVar4 !=
            (pCVar2->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
            super__Vector_impl_data._M_finish; ppCVar4 = ppCVar4 + 1) {
          ForceIDEval((*ppCVar4)->value_,out_cc,env);
          pCVar2 = this->cases_;
        }
        return;
      }
    case EXPR_CSTR:
    case EXPR_REGEX:
    case EXPR_SUBSCRIPT:
    case EXPR_PAREN:
    case EXPR_CALL:
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        if (this->operand_[lVar5] != (Expr *)0x0) {
          ForceIDEval(this->operand_[lVar5],out_cc,env);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void Expr::ForceIDEval(Output* out_cc, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
		case EXPR_SIZEOF:
		case EXPR_OFFSETOF:
			break;

		case EXPR_ID:
			if ( ! env->Evaluated(id_) )
				env->Evaluate(out_cc, id_);
			break;

		case EXPR_MEMBER:
			operand_[0]->ForceIDEval(out_cc, env);
			break;

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				(*i)->ForceIDEval(out_cc, env);
			}
			break;

		case EXPR_CASE:
			{
			operand_[0]->ForceIDEval(out_cc, env);
			foreach (i, CaseExprList, cases_)
				(*i)->value()->ForceIDEval(out_cc, env);
			}
			break;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					operand_[i]->ForceIDEval(out_cc, env);
			break;
		}
	}